

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O1

void __thiscall SSM::ECUPort::ECUPort(ECUPort *this,string *device_file_path)

{
  pointer pbVar1;
  int iVar2;
  DeviceException *this_00;
  int *piVar3;
  char *__s;
  allocator_type local_69;
  Bytes local_68;
  string local_50;
  
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ecu_id).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = open((device_file_path->_M_dataplus)._M_p,2);
  this->m_file = iVar2;
  if (-1 < iVar2) {
    configurePort(&this->m_file);
    ECUInit(&local_68,this);
    std::vector<std::byte,_std::allocator<std::byte>_>::_M_move_assign
              (&this->m_init_response,&local_68);
    if (local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pbVar1 = (this->m_init_response).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    std::vector<std::byte,std::allocator<std::byte>>::
    vector<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,std::allocator<std::byte>>>,void>
              ((vector<std::byte,std::allocator<std::byte>> *)&local_68,
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )(pbVar1 + 5),
               (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                )(pbVar1 + 10),&local_69);
    std::vector<std::byte,_std::allocator<std::byte>_>::_M_move_assign(&this->m_ecu_id,&local_68);
    if (local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (DeviceException *)__cxa_allocate_exception(0x28);
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)&local_68);
  DeviceException::DeviceException(this_00,&local_50);
  __cxa_throw(this_00,&DeviceException::typeinfo,Exception::~Exception);
}

Assistant:

ECUPort::ECUPort(const std::string& device_file_path)
  {
    // Open device file
    m_file = open(device_file_path.c_str(), O_RDWR);
    if (m_file<0) throw(DeviceException(strerror(errno)));

    // Configure port
    configurePort(m_file);

    // Initialize communication with ECU
    m_init_response = ECUInit();

    // The ECU identifier is part of the response. 
    Bytes::const_iterator it = skipToData(m_init_response);
    m_ecu_id = Bytes(it, it+5);
  }